

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void print_expr_struct_debug(lyxp_expr *exp)

{
  lyxp_expr_type lVar1;
  lyxp_expr_type *plVar2;
  char *pcVar3;
  size_t sVar4;
  ushort uVar5;
  ulong uVar6;
  char local_b8 [8];
  char tmp [128];
  
  if (2 < ly_log_level) {
    ly_log_dbg(8,"expression \"%s\":",exp->expr);
    for (uVar6 = 0; uVar6 < exp->used; uVar6 = uVar6 + 1) {
      pcVar3 = print_token(exp->tokens[uVar6]);
      sprintf(local_b8,"\ttoken %s, in expression \"%.*s\"",pcVar3,(ulong)exp->tok_len[uVar6],
              exp->expr + exp->expr_pos[uVar6]);
      plVar2 = exp->repeat[uVar6];
      if (plVar2 != (lyxp_expr_type *)0x0) {
        sVar4 = strlen(local_b8);
        sprintf(local_b8 + sVar4," (repeat %d",(ulong)*plVar2);
        for (uVar5 = 1; lVar1 = exp->repeat[uVar6][uVar5], lVar1 != LYXP_EXPR_NONE;
            uVar5 = uVar5 + 1) {
          sVar4 = strlen(local_b8);
          sprintf(local_b8 + sVar4,", %d",(ulong)lVar1);
        }
        sVar4 = strlen(local_b8);
        (local_b8 + sVar4)[0] = ')';
        (local_b8 + sVar4)[1] = '\0';
      }
      ly_log_dbg(8,local_b8);
    }
  }
  return;
}

Assistant:

static void
print_expr_struct_debug(struct lyxp_expr *exp)
{
    uint16_t i, j;
    char tmp[128];

    if (!exp || (ly_log_level < LY_LLDBG)) {
        return;
    }

    LOGDBG(LY_LDGXPATH, "expression \"%s\":", exp->expr);
    for (i = 0; i < exp->used; ++i) {
        sprintf(tmp, "\ttoken %s, in expression \"%.*s\"", print_token(exp->tokens[i]), exp->tok_len[i],
               &exp->expr[exp->expr_pos[i]]);
        if (exp->repeat[i]) {
            sprintf(tmp + strlen(tmp), " (repeat %d", exp->repeat[i][0]);
            for (j = 1; exp->repeat[i][j]; ++j) {
                sprintf(tmp + strlen(tmp), ", %d", exp->repeat[i][j]);
            }
            strcat(tmp, ")");
        }
        LOGDBG(LY_LDGXPATH, tmp);
    }
}